

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O0

bool __thiscall
iDynTree::AttitudeQuaternionEKF::setInternalStateInitialOrientation
          (AttitudeQuaternionEKF *this,Span<double,__1L> *orientationBuffer)

{
  element_type eVar1;
  size_t sVar2;
  size_t sVar3;
  reference peVar4;
  double *pdVar5;
  DiscreteExtendedKalmanFilterHelper *this_00;
  long in_RDI;
  bool ok;
  Span<double,__1L> x0_span;
  AttitudeQuaternionEKF *in_stack_000000a0;
  index_type in_stack_ffffffffffffff98;
  pointer ptr;
  Span<double,__1L> *in_stack_ffffffffffffffa0;
  Span<double,__1L> *this_01;
  Span<double,__1L> *x0;
  bool local_1;
  
  sVar2 = Span<double,_-1L>::size((Span<double,__1L> *)0x625092);
  sVar3 = VectorFixSize<4U>::size((VectorFixSize<4U> *)(in_RDI + 0x1f0));
  if (sVar2 == sVar3) {
    peVar4 = Span<double,_-1L>::operator()(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    ptr = (pointer)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x1f0),0);
    *pdVar5 = (double)ptr;
    peVar4 = Span<double,_-1L>::operator()(in_stack_ffffffffffffffa0,(index_type)ptr);
    this_01 = (Span<double,__1L> *)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x1f0),1);
    *pdVar5 = (double)this_01;
    peVar4 = Span<double,_-1L>::operator()(this_01,(index_type)ptr);
    eVar1 = *peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x1f0),2);
    *pdVar5 = eVar1;
    peVar4 = Span<double,_-1L>::operator()(this_01,(index_type)ptr);
    x0 = (Span<double,__1L> *)*peVar4;
    pdVar5 = VectorFixSize<4U>::operator()((VectorFixSize<4U> *)(in_RDI + 0x1f0),3);
    *pdVar5 = (double)x0;
    memcpy((void *)(in_RDI + 0x240),(void *)(in_RDI + 0x1f0),0x50);
    serializeStateVector(in_stack_000000a0);
    this_00 = (DiscreteExtendedKalmanFilterHelper *)iDynTree::VectorDynSize::data();
    iDynTree::VectorDynSize::size();
    Span<double,_-1L>::Span(this_01,ptr,0x62521c);
    local_1 = DiscreteExtendedKalmanFilterHelper::ekfSetInitialState(this_00,x0);
  }
  else {
    iDynTree::reportError
              ("AttitudeQuaternionEKF","setInternalStateInitialOrientation",
               "orientation size mismatch, using default state");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::setInternalStateInitialOrientation(const iDynTree::Span< double >& orientationBuffer)
{
    if ((size_t)orientationBuffer.size() != m_state_qekf.m_orientation.size())
    {
        iDynTree::reportError("AttitudeQuaternionEKF", "setInternalStateInitialOrientation", "orientation size mismatch, using default state");
        return false;
    }

    m_state_qekf.m_orientation(0) = orientationBuffer(0);
    m_state_qekf.m_orientation(1) = orientationBuffer(1);
    m_state_qekf.m_orientation(2) = orientationBuffer(2);
    m_state_qekf.m_orientation(3) = orientationBuffer(3);

    m_initial_state_qekf = m_state_qekf;
    serializeStateVector();
    iDynTree::Span<double> x0_span(m_x.data(), m_x.size());
    bool ok = ekfSetInitialState(x0_span);

    return ok;
}